

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiViewportFlags *pIVar1;
  ImGuiID *pIVar2;
  ImGuiID *pIVar3;
  ImVec2 IVar4;
  ImGuiID IVar5;
  ImGuiWindow *pIVar6;
  ImGuiContext *pIVar7;
  ImGuiContext *g;
  float fVar8;
  float fVar9;
  ImVec2 pos;
  ImVec2 local_18;
  
  pIVar7 = GImGui;
  pIVar6 = GImGui->MovingWindow;
  if (pIVar6 == (ImGuiWindow *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow *)0x0) {
      return;
    }
    IVar5 = GImGui->ActiveId;
    if (GImGui->ActiveIdWindow->MoveId != IVar5) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar5;
    if (pIVar7->ActiveIdPreviousFrame == IVar5) {
      pIVar7->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar7->IO).MouseDown[0] != false) {
      return;
    }
    ClearActiveID();
    return;
  }
  pIVar2 = &GImGui->ActiveId;
  pIVar3 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar2;
  if (*pIVar3 == *pIVar2) {
    pIVar7->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar6 = pIVar6->RootWindow;
  if ((pIVar7->IO).MouseDown[0] != true) {
LAB_00152dc5:
    if ((pIVar7->ConfigFlagsCurrFrame & 0x400) != 0) {
      UpdateTryMergeWindowIntoHostViewport(pIVar6,pIVar7->MouseViewport);
    }
    if ((GImGui->DragDropActive != true) || (GImGui->DragDropAcceptIdPrev == 0)) {
      pIVar7->MouseViewport = pIVar6->Viewport;
    }
    pIVar1 = &(pIVar6->Viewport->super_ImGuiViewport).Flags;
    *pIVar1 = *pIVar1 & 0xffffffef;
    ClearActiveID();
    pIVar7->MovingWindow = (ImGuiWindow *)0x0;
    return;
  }
  IVar4 = (pIVar7->IO).MousePos;
  fVar8 = IVar4.x;
  if ((fVar8 < -256000.0) || (fVar9 = IVar4.y, fVar9 < -256000.0)) goto LAB_00152dc5;
  local_18.x = fVar8 - (pIVar7->ActiveIdClickOffset).x;
  local_18.y = fVar9 - (pIVar7->ActiveIdClickOffset).y;
  fVar8 = (pIVar6->Pos).x;
  if ((fVar8 == local_18.x) && (!NAN(fVar8) && !NAN(local_18.x))) {
    fVar8 = (pIVar6->Pos).y;
    if ((fVar8 == local_18.y) && (!NAN(fVar8) && !NAN(local_18.y))) goto LAB_00152db4;
  }
  if (((pIVar6->Flags & 0x100) == 0) && (pIVar7->SettingsDirtyTimer <= 0.0)) {
    pIVar7->SettingsDirtyTimer = (pIVar7->IO).IniSavingRate;
  }
  SetWindowPos(pIVar6,&local_18,1);
  if (pIVar6->ViewportOwned == true) {
    (pIVar6->Viewport->super_ImGuiViewport).Pos = local_18;
  }
LAB_00152db4:
  FocusWindow(pIVar7->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindow);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindow;
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos))
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                    moving_window->Viewport->Pos = pos;
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            // Try to merge the window back into the main viewport.
            // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
            if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

            // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
            if (!IsDragDropPayloadBeingAccepted())
                g.MouseViewport = moving_window->Viewport;

            // Clear the NoInput window flag set by the Viewport system
            moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs;

            ClearActiveID();
            g.MovingWindow = NULL;
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}